

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VCCluster::addItem(VCCluster *this,VCFace *f)

{
  bool bVar1;
  long in_RSI;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_RDI;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_ffffffffffffff88;
  key_type *in_stack_ffffffffffffff90;
  _Base_ptr *this_00;
  Scalar *in_stack_ffffffffffffffa0;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_ffffffffffffffa8;
  MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_ffffffffffffffb0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffffb8;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::find
                 (in_RDI,in_stack_ffffffffffffff90);
  local_20._M_node =
       (_Base_ptr)
       std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::end
                 ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
                  in_stack_ffffffffffffff88);
  bVar1 = std::operator==(&local_18,&local_20);
  if (bVar1) {
    std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::insert
              ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)
               in_stack_ffffffffffffffb0,(value_type *)in_stack_ffffffffffffffa8);
    in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(*(double *)(local_10 + 0x120) +
                 (double)in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = &in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_ffffffffffffffb8,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffffb0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,in_stack_ffffffffffffff88);
    *(set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)(local_10 + 0x140) = in_RDI;
    Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator+=
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    (*(code *)**(undefined8 **)&(in_RDI->_M_t)._M_impl)(in_RDI,local_10);
  }
  return;
}

Assistant:

void VCCluster::addItem(VCFace* f) {
	if (items.find(f) == items.end()) {
		items.insert(f);
		area += f->area;
		weightedSum = weightedSum + f->center * f->area;
		f->cluster = this;
		E += f->E;
		addItemAdditionalAct(f);
	}
}